

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O1

void __thiscall
Gluco::Heap<Gluco::Solver::VarOrderLt>::build(Heap<Gluco::Solver::VarOrderLt> *this,vec<int> *ns)

{
  uint uVar1;
  int *piVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  if (0 < (this->heap).sz) {
    piVar2 = (this->heap).data;
    piVar3 = (this->indices).data;
    lVar4 = 0;
    do {
      piVar3[piVar2[lVar4]] = -1;
      lVar4 = lVar4 + 1;
    } while (lVar4 < (this->heap).sz);
  }
  if ((this->heap).data != (int *)0x0) {
    (this->heap).sz = 0;
  }
  if (0 < ns->sz) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      piVar2 = ns->data;
      (this->indices).data[*(int *)((long)piVar2 + lVar4)] = (int)lVar5;
      vec<int>::push(&this->heap,(int *)((long)piVar2 + lVar4));
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 4;
    } while (lVar5 < ns->sz);
  }
  uVar1 = (this->heap).sz;
  if (1 < (int)uVar1) {
    iVar6 = (uVar1 >> 1) + 1;
    do {
      percolateDown(this,iVar6 + -2);
      iVar6 = iVar6 + -1;
    } while (1 < iVar6);
  }
  return;
}

Assistant:

void build(vec<int>& ns) {
        int i;
        for (i = 0; i < heap.size(); i++)
            indices[heap[i]] = -1;
        heap.clear();

        for (i = 0; i < ns.size(); i++){
            indices[ns[i]] = i;
            heap.push(ns[i]); }

        for (i = heap.size() / 2 - 1; i >= 0; i--)
            percolateDown(i);
    }